

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O0

void Abc_ManCollectLatches_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLatches)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pDriver;
  Vec_Ptr_t *vLatches_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsLatch(pObj);
  if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pObj);
    pAVar2 = Abc_ObjFanin0(pObj);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_ObjIsBo(pAVar2);
    if (iVar1 != 0) {
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Abc_ManCollectLatches_rec(pAVar2,vLatches);
    }
    Vec_PtrPush(vLatches,pObj);
  }
  return;
}

Assistant:

void Abc_ManCollectLatches_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLatches )
{
    Abc_Obj_t * pDriver;
    if ( !Abc_ObjIsLatch(pObj) )
        return;
    // skip already collected latches
    if ( Abc_NodeIsTravIdCurrent(pObj)  )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    // get the driver node feeding into the latch
    pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
    // call recursively if the driver looks like a latch output
    if ( Abc_ObjIsBo(pDriver) )
        Abc_ManCollectLatches_rec( Abc_ObjFanin0(pDriver), vLatches );
    // collect the latch
    Vec_PtrPush( vLatches, pObj );
}